

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_avx2_256_64.c
# Opt level: O3

parasail_result_t *
parasail_nw_stats_scan_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  __m256i alVar2;
  undefined1 auVar3 [32];
  __m256i alVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  void *pvVar7;
  void *pvVar8;
  ulong uVar9;
  undefined1 auVar10 [32];
  __m256i alVar11;
  undefined1 auVar12 [32];
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  bool bVar15;
  bool bVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  parasail_result_t *ppVar20;
  __m256i *b;
  __m256i *b_00;
  __m256i *b_01;
  __m256i *b_02;
  __m256i *ptr;
  __m256i *b_03;
  __m256i *b_04;
  __m256i *b_05;
  __m256i *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  __m256i *ptr_04;
  __m256i *ptr_05;
  int64_t *ptr_06;
  long lVar21;
  undefined8 uVar22;
  uint uVar23;
  ulong uVar25;
  long lVar26;
  __m256i *palVar27;
  undefined4 in_register_00000014;
  ulong uVar28;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  ulong size;
  int iVar34;
  undefined1 auVar35 [16];
  undefined1 auVar42 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar47 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  undefined4 in_stack_fffffffffffffd68;
  undefined1 local_288 [32];
  undefined1 local_1f8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_138 [32];
  undefined1 local_f8 [32];
  int iVar24;
  
  auVar38 = local_1f8;
  auVar56 = in_ZMM6._0_32_;
  local_1f8._4_4_ = in_register_00000014;
  local_1f8._0_4_ = s2Len;
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_scan_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar5 = (profile->profile64).score;
    if (pvVar5 == (void *)0x0) {
      parasail_nw_stats_scan_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_scan_profile_avx2_256_64_cold_6();
      }
      else {
        uVar23 = profile->s1Len;
        if ((int)uVar23 < 1) {
          parasail_nw_stats_scan_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_scan_profile_avx2_256_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_stats_scan_profile_avx2_256_64_cold_3();
        }
        else if (open < 0) {
          parasail_nw_stats_scan_profile_avx2_256_64_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_stats_scan_profile_avx2_256_64_cold_1();
        }
        else {
          local_1f8._8_24_ = auVar38._8_24_;
          uVar29 = uVar23 - 1;
          uVar33 = (ulong)uVar23 + 3;
          size = uVar33 >> 2;
          uVar9 = (ulong)uVar29 % size;
          pvVar7 = (profile->profile64).matches;
          pvVar8 = (profile->profile64).similar;
          uVar25 = CONCAT44(0,open);
          iVar34 = -open;
          iVar19 = ppVar6->min;
          uVar28 = 0x8000000000000000 - (long)iVar19;
          if (iVar19 != iVar34 && SBORROW4(iVar19,iVar34) == iVar19 + open < 0) {
            uVar28 = uVar25 | 0x8000000000000000;
          }
          iVar19 = ppVar6->max;
          ppVar20 = parasail_result_new_stats();
          if (ppVar20 != (parasail_result_t *)0x0) {
            local_f8._0_4_ = gap;
            local_138._0_4_ = iVar34;
            iVar30 = (int)(uVar29 / size);
            ppVar20->flag = ppVar20->flag | 0x4810401;
            b = parasail_memalign___m256i(0x20,size);
            b_00 = parasail_memalign___m256i(0x20,size);
            b_01 = parasail_memalign___m256i(0x20,size);
            b_02 = parasail_memalign___m256i(0x20,size);
            ptr = parasail_memalign___m256i(0x20,size);
            b_03 = parasail_memalign___m256i(0x20,size);
            b_04 = parasail_memalign___m256i(0x20,size);
            b_05 = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign___m256i(0x20,size);
            ptr_01 = parasail_memalign___m256i(0x20,size);
            ptr_02 = parasail_memalign___m256i(0x20,size);
            ptr_03 = parasail_memalign___m256i(0x20,size);
            ptr_04 = parasail_memalign___m256i(0x20,size);
            ptr_05 = parasail_memalign___m256i(0x20,size);
            ptr_06 = parasail_memalign_int64_t(0x20,(ulong)(s2Len + 1));
            auVar44._8_8_ = 0;
            auVar44._0_8_ = b;
            auVar47._8_8_ = 0;
            auVar47._0_8_ = b_00;
            auVar44 = vpunpcklqdq_avx(auVar44,auVar47);
            auVar35._8_8_ = 0;
            auVar35._0_8_ = b_01;
            auVar42._8_8_ = 0;
            auVar42._0_8_ = b_02;
            auVar47 = vpunpcklqdq_avx(auVar35,auVar42);
            auVar35 = ZEXT116(0) * auVar47 + ZEXT116(1) * auVar44;
            auVar42 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar47;
            auVar43._8_8_ = 0;
            auVar43._0_8_ = ptr;
            auVar48._8_8_ = 0;
            auVar48._0_8_ = b_03;
            auVar44 = vpunpcklqdq_avx(auVar43,auVar48);
            auVar49._8_8_ = 0;
            auVar49._0_8_ = b_04;
            auVar51._8_8_ = 0;
            auVar51._0_8_ = b_05;
            auVar47 = vpunpcklqdq_avx(auVar49,auVar51);
            auVar44 = ZEXT116(0) * auVar47 + ZEXT116(1) * auVar44;
            auVar47 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar47;
            auVar40 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar38._0_8_ = -(ulong)(auVar35._0_8_ == 0);
            auVar38._8_8_ = -(ulong)(auVar35._8_8_ == 0);
            auVar38._16_8_ = -(ulong)(auVar42._0_8_ == 0);
            auVar38._24_8_ = -(ulong)(auVar42._8_8_ == 0);
            auVar45._0_8_ = -(ulong)(auVar44._0_8_ == 0);
            auVar45._8_8_ = -(ulong)(auVar44._8_8_ == 0);
            auVar45._16_8_ = -(ulong)(auVar47._0_8_ == 0);
            auVar45._24_8_ = -(ulong)(auVar47._8_8_ == 0);
            auVar38 = vpackssdw_avx2(auVar38,auVar45);
            if (((((ptr_04 != (__m256i *)0x0 && ptr_03 != (__m256i *)0x0) &&
                  ptr_05 != (__m256i *)0x0) &&
                 ((ptr_01 != (__m256i *)0x0 && ptr_00 != (__m256i *)0x0) && ptr_02 != (__m256i *)0x0
                 )) && ptr_06 != (int64_t *)0x0) &&
                ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar38 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar38 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar38 >> 0x7f,0) == '\0') &&
                   (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar38 >> 0xbf,0) == '\0') &&
                 (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar38[0x1f])) {
              iVar17 = s2Len + -1;
              iVar18 = 3 - iVar30;
              auVar36._8_4_ = gap;
              auVar36._0_8_ = CONCAT44(0,gap);
              auVar36._12_4_ = 0;
              auVar36._16_4_ = gap;
              auVar36._20_4_ = 0;
              auVar36._24_4_ = gap;
              auVar36._28_4_ = 0;
              uVar28 = uVar28 + 1;
              lVar26 = 0x7ffffffffffffffe - (long)iVar19;
              auVar37._8_8_ = uVar33;
              auVar37._0_8_ = uVar33;
              auVar37._16_8_ = uVar33;
              auVar37._24_8_ = uVar33;
              auVar38 = vpsrlq_avx2(auVar37,2);
              auVar37 = vpblendd_avx2(auVar38,ZEXT1632((undefined1  [16])0x0),3);
              iVar19 = (int)size;
              lVar21 = (long)-(gap * iVar19);
              auVar39._8_8_ = lVar21;
              auVar39._0_8_ = lVar21;
              auVar39._16_8_ = lVar21;
              auVar39._24_8_ = lVar21;
              auVar38 = vpblendd_avx2(auVar39,ZEXT1632((undefined1  [16])0x0),3);
              auVar38 = vpaddq_avx2(ZEXT832(uVar28),auVar38);
              alVar11[1] = (longlong)b;
              alVar11[0] = (longlong)b_00;
              alVar11[2]._0_4_ = in_stack_fffffffffffffd68;
              alVar11[2]._4_4_ = iVar30;
              alVar11[3] = (longlong)ptr_04;
              parasail_memset___m256i(b_03,alVar11,size);
              alVar1[1] = (longlong)b;
              alVar1[0] = (longlong)b_00;
              alVar1[2]._0_4_ = in_stack_fffffffffffffd68;
              alVar1[2]._4_4_ = iVar30;
              alVar1[3] = (longlong)ptr_04;
              parasail_memset___m256i(b_04,alVar1,size);
              alVar2[1] = (longlong)b;
              alVar2[0] = (longlong)b_00;
              alVar2[2]._0_4_ = in_stack_fffffffffffffd68;
              alVar2[2]._4_4_ = iVar30;
              alVar2[3] = (longlong)ptr_04;
              parasail_memset___m256i(b_05,alVar2,size);
              alVar4[1] = (longlong)b;
              alVar4[0] = (longlong)b_00;
              alVar4[2]._0_4_ = in_stack_fffffffffffffd68;
              alVar4[2]._4_4_ = iVar30;
              alVar4[3] = (longlong)ptr_04;
              parasail_memset___m256i(b,alVar4,size);
              c[1] = (longlong)b;
              c[0] = (longlong)b_00;
              c[2]._0_4_ = in_stack_fffffffffffffd68;
              c[2]._4_4_ = iVar30;
              c[3] = (longlong)ptr_04;
              parasail_memset___m256i(b_00,c,size);
              c_00[1] = (longlong)b;
              c_00[0] = (longlong)b_00;
              c_00[2]._0_4_ = in_stack_fffffffffffffd68;
              c_00[2]._4_4_ = iVar30;
              c_00[3] = (longlong)ptr_04;
              parasail_memset___m256i(b_01,c_00,size);
              c_01[1] = (longlong)b;
              c_01[0] = (longlong)b_00;
              c_01[2]._0_4_ = in_stack_fffffffffffffd68;
              c_01[2]._4_4_ = iVar30;
              c_01[3] = (longlong)ptr_04;
              parasail_memset___m256i(b_02,c_01,size);
              auVar53._8_4_ = open;
              auVar53._0_8_ = uVar25;
              auVar53._12_4_ = 0;
              auVar53._16_4_ = open;
              auVar53._20_4_ = 0;
              auVar53._24_4_ = open;
              auVar53._28_4_ = 0;
              auVar53 = vpsubq_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar53);
              uVar31 = (ulong)(iVar19 - 1);
              lVar21 = uVar31 << 5;
              auVar61._8_8_ = 1;
              auVar61._0_8_ = 1;
              auVar61._16_8_ = 1;
              auVar61._24_8_ = 1;
              auVar45 = vpcmpeqd_avx2(auVar40,auVar40);
              uVar33 = size;
              do {
                *(undefined1 (*) [32])((long)*ptr_04 + lVar21) = auVar53;
                *(undefined1 (*) [32])((long)*ptr_05 + lVar21) = auVar61;
                auVar53 = vpsubq_avx2(auVar53,auVar36);
                auVar61 = vpsubq_avx2(auVar61,auVar45);
                lVar21 = lVar21 + -0x20;
                iVar24 = (int)uVar33;
                uVar23 = iVar24 - 1;
                uVar33 = (ulong)uVar23;
              } while (uVar23 != 0 && 0 < iVar24);
              lVar21 = (long)iVar34;
              auVar50._4_4_ = iVar19;
              auVar50._0_4_ = iVar19;
              auVar50._8_4_ = iVar19;
              auVar50._12_4_ = iVar19;
              auVar50._16_4_ = iVar19;
              auVar50._20_4_ = iVar19;
              auVar50._24_4_ = iVar19;
              auVar50._28_4_ = iVar19;
              auVar40._8_4_ = gap;
              auVar40._0_8_ = CONCAT44(0,gap);
              auVar40._12_4_ = 0;
              auVar40._16_4_ = gap;
              auVar40._20_4_ = 0;
              auVar40._24_4_ = gap;
              auVar40._28_4_ = 0;
              auVar46._8_8_ = lVar21;
              auVar46._0_8_ = lVar21;
              auVar46._16_8_ = lVar21;
              auVar46._24_8_ = lVar21;
              auVar45 = vpmuldq_avx2(auVar50,_DAT_00908b60);
              uVar33 = 0;
              palVar27 = ptr;
              do {
                auVar52._8_8_ = uVar33;
                auVar52._0_8_ = uVar33;
                auVar52._16_8_ = uVar33;
                auVar52._24_8_ = uVar33;
                auVar53 = vpaddq_avx2(auVar45,auVar52);
                auVar61 = vpmuludq_avx2(auVar53,auVar40);
                auVar53 = vpsrlq_avx2(auVar53,0x20);
                auVar53 = vpmuludq_avx2(auVar53,auVar40);
                auVar53 = vpsllq_avx2(auVar53,0x20);
                auVar53 = vpaddq_avx2(auVar61,auVar53);
                alVar11 = (__m256i)vpsubq_avx2(auVar46,auVar53);
                *palVar27 = alVar11;
                uVar33 = uVar33 + 1;
                palVar27 = palVar27 + 1;
              } while (size != uVar33);
              *ptr_06 = 0;
              lVar21 = (ulong)(uint)s2Len - 1;
              auVar55._8_8_ = lVar21;
              auVar55._0_8_ = lVar21;
              auVar55._16_8_ = lVar21;
              auVar55._24_8_ = lVar21;
              auVar45 = vpmovsxbq_avx2(ZEXT416(0x4030201));
              uVar33 = 0;
              auVar53 = vpmovsxbq_avx2(ZEXT416(0x3020100));
              auVar54._8_8_ = 0x8000000000000000;
              auVar54._0_8_ = 0x8000000000000000;
              auVar54._16_8_ = 0x8000000000000000;
              auVar54._24_8_ = 0x8000000000000000;
              auVar56 = vpcmpeqd_avx2(auVar56,auVar56);
              auVar57._8_8_ = 4;
              auVar57._0_8_ = 4;
              auVar57._16_8_ = 4;
              auVar57._24_8_ = 4;
              do {
                auVar59._8_8_ = uVar33;
                auVar59._0_8_ = uVar33;
                auVar59._16_8_ = uVar33;
                auVar59._24_8_ = uVar33;
                auVar61 = vpor_avx2(auVar59,auVar53);
                auVar39 = vpcmpgtq_avx2(auVar61 ^ auVar54,auVar55 ^ auVar54);
                auVar61 = vpaddq_avx2(auVar45,auVar56);
                auVar50 = vpmuludq_avx2(auVar61,auVar40);
                auVar61 = vpsrlq_avx2(auVar61,0x20);
                auVar61 = vpmuludq_avx2(auVar61,auVar40);
                auVar61 = vpsllq_avx2(auVar61,0x20);
                auVar61 = vpaddq_avx2(auVar50,auVar61);
                auVar61 = vpsubq_avx2(auVar46,auVar61);
                auVar61 = vpmaskmovq_avx2(auVar39 ^ auVar56,auVar61);
                *(undefined1 (*) [32])(ptr_06 + uVar33 + 1) = auVar61;
                uVar33 = uVar33 + 4;
                auVar45 = vpaddq_avx2(auVar45,auVar57);
              } while ((s2Len + 3U & 0xfffffffc) != uVar33);
              uVar33 = 0;
              local_198._8_8_ = uVar28;
              local_198._0_8_ = uVar28;
              local_198._16_8_ = uVar28;
              local_198._24_8_ = uVar28;
              auVar56._8_8_ = lVar26;
              auVar56._0_8_ = lVar26;
              auVar56._16_8_ = lVar26;
              auVar56._24_8_ = lVar26;
              local_178 = auVar56;
              do {
                alVar11 = b_03[uVar31];
                alVar1 = b_04[uVar31];
                alVar2 = b_05[uVar31];
                auVar44 = SUB3216(ptr[uVar31],0);
                auVar58._0_16_ = ZEXT116(0) * auVar44 + ZEXT116(1) * auVar56._0_16_;
                auVar58._16_16_ = ZEXT116(0) * auVar56._16_16_ + ZEXT116(1) * auVar44;
                auVar56 = vpalignr_avx2((undefined1  [32])ptr[uVar31],auVar58,8);
                auVar45 = vperm2i128_avx2((undefined1  [32])alVar11,(undefined1  [32])alVar11,8);
                auVar45 = vpalignr_avx2((undefined1  [32])alVar11,auVar45,8);
                auVar40 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,8);
                auVar40 = vpalignr_avx2((undefined1  [32])alVar1,auVar40,8);
                auVar53 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,8);
                auVar53 = vpalignr_avx2((undefined1  [32])alVar2,auVar53,8);
                auVar56 = vpblendd_avx2(auVar56,ZEXT832((ulong)ptr_06[uVar33]),3);
                lVar32 = (long)ppVar6->mapper[(byte)s2[uVar33]] * size * 0x20;
                auVar10._8_8_ = uVar28;
                auVar10._0_8_ = uVar28;
                auVar10._16_8_ = uVar28;
                auVar10._24_8_ = uVar28;
                auVar61 = vpsubq_avx2(auVar10,(undefined1  [32])*ptr_04);
                local_288 = ZEXT1632(ZEXT816(0));
                lVar21 = 0;
                auVar62 = ZEXT864(0) << 0x40;
                auVar60 = ZEXT1664((undefined1  [16])0x0);
                do {
                  auVar55 = vpaddq_avx2(auVar56,*(undefined1 (*) [32])
                                                 ((long)pvVar5 + lVar21 + lVar32));
                  auVar56 = *(undefined1 (*) [32])((long)*ptr + lVar21);
                  auVar57 = vpaddq_avx2(auVar45,*(undefined1 (*) [32])
                                                 ((long)pvVar7 + lVar21 + lVar32));
                  auVar59 = vpaddq_avx2(auVar40,*(undefined1 (*) [32])
                                                 ((long)pvVar8 + lVar21 + lVar32));
                  auVar45 = *(undefined1 (*) [32])((long)*b_03 + lVar21);
                  auVar40 = *(undefined1 (*) [32])((long)*b_04 + lVar21);
                  auVar39 = vpaddq_avx2(auVar61,*(undefined1 (*) [32])((long)*ptr_04 + lVar21));
                  auVar50 = vpcmpgtq_avx2(auVar39,auVar10);
                  auVar10 = vblendvpd_avx(auVar10,auVar39,auVar50);
                  auVar61 = vpcmpeqd_avx2(auVar61,auVar61);
                  auVar58 = vpsubq_avx2(auVar53,auVar61);
                  auVar53 = *(undefined1 (*) [32])((long)*b_05 + lVar21);
                  auVar39 = vblendvpd_avx(auVar60._0_32_,local_f8,auVar50);
                  auVar60 = ZEXT3264(auVar39);
                  auVar46 = vblendvpd_avx(auVar62._0_32_,local_1f8,auVar50);
                  auVar62 = ZEXT3264(auVar46);
                  auVar12._8_4_ = open;
                  auVar12._0_8_ = uVar25;
                  auVar12._12_4_ = 0;
                  auVar12._16_4_ = open;
                  auVar12._20_4_ = 0;
                  auVar12._24_4_ = open;
                  auVar12._28_4_ = 0;
                  auVar52 = vpsubq_avx2(auVar56,auVar12);
                  auVar61 = vpaddq_avx2(local_138,*(undefined1 (*) [32])((long)*ptr_05 + lVar21));
                  local_288 = vblendvpd_avx(local_288,auVar61,auVar50);
                  auVar61 = vpsubq_avx2(*(undefined1 (*) [32])((long)*b + lVar21),auVar36);
                  auVar54 = vpcmpgtq_avx2(auVar52,auVar61);
                  auVar61 = vblendvpd_avx(auVar61,auVar52,auVar54);
                  auVar50 = vblendvpd_avx(*(undefined1 (*) [32])((long)*b_00 + lVar21),auVar45,
                                          auVar54);
                  auVar52 = vblendvpd_avx(*(undefined1 (*) [32])((long)*b_01 + lVar21),auVar40,
                                          auVar54);
                  auVar54 = vblendvpd_avx(*(undefined1 (*) [32])((long)*b_02 + lVar21),auVar53,
                                          auVar54);
                  auVar12 = vpsubq_avx2(auVar54,_DAT_00909280);
                  auVar54 = vpcmpgtq_avx2(auVar61,auVar55);
                  *(undefined1 (*) [32])((long)*b + lVar21) = auVar61;
                  auVar61 = vblendvpd_avx(auVar55,auVar61,auVar54);
                  *(undefined1 (*) [32])((long)*b_00 + lVar21) = auVar50;
                  local_f8 = vblendvpd_avx(auVar57,auVar50,auVar54);
                  *(undefined1 (*) [32])((long)*b_01 + lVar21) = auVar52;
                  local_1f8 = vblendvpd_avx(auVar59,auVar52,auVar54);
                  local_138 = vblendvpd_avx(auVar58,auVar12,auVar54);
                  *(undefined1 (*) [32])((long)*b_02 + lVar21) = auVar12;
                  *(undefined1 (*) [32])((long)*ptr + lVar21) = auVar55;
                  *(undefined1 (*) [32])((long)*b_03 + lVar21) = auVar57;
                  *(undefined1 (*) [32])((long)*b_04 + lVar21) = auVar59;
                  *(undefined1 (*) [32])((long)*b_05 + lVar21) = auVar58;
                  lVar21 = lVar21 + 0x20;
                } while (size << 5 != lVar21);
                auVar52 = vpermpd_avx2(auVar61,0x90);
                auVar56 = vperm2f128_avx(local_f8,local_f8,8);
                local_f8 = vpalignr_avx2(local_f8,auVar56,8);
                auVar56 = vperm2f128_avx(local_1f8,local_1f8,8);
                local_1f8 = vpalignr_avx2(local_1f8,auVar56,8);
                auVar56 = vperm2f128_avx(local_138,local_138,8);
                local_138 = vpalignr_avx2(local_138,auVar56,8);
                lVar21 = uVar33 + 1;
                auVar56 = vblendpd_avx(auVar52,ZEXT832((ulong)ptr_06[lVar21]),1);
                auVar45 = vpaddq_avx2(auVar56,(undefined1  [32])*ptr_04);
                auVar50 = vpcmpgtq_avx2(auVar10,auVar45);
                auVar40 = vblendvpd_avx(auVar45,auVar10,auVar50);
                auVar53 = vblendvpd_avx(local_f8,auVar39,auVar50);
                auVar61 = vblendvpd_avx(local_1f8,auVar46,auVar50);
                auVar45 = vpaddq_avx2(local_138,(undefined1  [32])*ptr_05);
                uVar33 = uVar33 + 1;
                auVar45 = vblendvpd_avx(auVar45,local_288,auVar50);
                bVar15 = true;
                do {
                  bVar16 = bVar15;
                  auVar39 = vperm2f128_avx(auVar40,auVar40,8);
                  auVar39 = vpalignr_avx2(auVar40,auVar39,8);
                  auVar46 = vpaddq_avx2(auVar38,auVar39);
                  auVar39 = vperm2f128_avx(auVar53,auVar53,8);
                  auVar50 = vpalignr_avx2(auVar53,auVar39,8);
                  auVar39 = vperm2f128_avx(auVar61,auVar61,8);
                  auVar54 = vpalignr_avx2(auVar61,auVar39,8);
                  auVar39 = vperm2f128_avx(auVar45,auVar45,8);
                  auVar39 = vpalignr_avx2(auVar45,auVar39,8);
                  auVar39 = vpaddq_avx2(auVar39,auVar37);
                  auVar55 = vpcmpgtq_avx2(auVar40,auVar46);
                  auVar40 = vblendvpd_avx(auVar46,auVar40,auVar55);
                  auVar53 = vblendvpd_avx(auVar50,auVar53,auVar55);
                  auVar61 = vblendvpd_avx(auVar54,auVar61,auVar55);
                  auVar45 = vblendvpd_avx(auVar39,auVar45,auVar55);
                  bVar15 = false;
                } while (bVar16);
                auVar39 = vperm2f128_avx(auVar40,auVar40,8);
                auVar50 = vpalignr_avx2(auVar40,auVar39,8);
                auVar40 = vperm2f128_avx(auVar53,auVar53,8);
                auVar39 = vpalignr_avx2(auVar53,auVar40,8);
                auVar40 = vperm2f128_avx(auVar61,auVar61,8);
                auVar46 = vpalignr_avx2(auVar61,auVar40,8);
                auVar54 = vperm2f128_avx(auVar45,auVar45,8);
                auVar50 = vpaddq_avx2(auVar50,ZEXT832(uVar28));
                auVar55 = vpcmpgtq_avx2(auVar50,auVar56);
                auVar56 = vblendpd_avx(ZEXT832((ulong)ptr_06[lVar21]),auVar52,0xe);
                auVar40 = vpcmpgtq_avx2(auVar50,auVar56);
                auVar53 = vblendvpd_avx(auVar56,auVar50,auVar40);
                auVar40 = vblendvpd_avx(local_f8,auVar39,auVar55);
                auVar61 = vblendvpd_avx(local_1f8,auVar46,auVar55);
                auVar52 = vpalignr_avx2(auVar45,auVar54,8);
                auVar45 = vblendvpd_avx(local_138,auVar52,auVar55);
                lVar21 = 0;
                do {
                  auVar3._8_4_ = open;
                  auVar3._0_8_ = uVar25;
                  auVar3._12_4_ = 0;
                  auVar3._16_4_ = open;
                  auVar3._20_4_ = 0;
                  auVar3._24_4_ = open;
                  auVar3._28_4_ = 0;
                  auVar56 = *(undefined1 (*) [32])((long)*ptr + lVar21);
                  auVar54 = vpsubq_avx2(auVar53,auVar3);
                  auVar50 = vpsubq_avx2(auVar50,auVar36);
                  auVar53 = vpcmpgtq_avx2(auVar54,auVar50);
                  auVar39 = vblendvpd_avx(auVar39,auVar40,auVar53);
                  auVar46 = vblendvpd_avx(auVar46,auVar61,auVar53);
                  auVar52 = vblendvpd_avx(auVar52,auVar45,auVar53);
                  auVar50 = vblendvpd_avx(auVar50,auVar54,auVar53);
                  auVar45 = *(undefined1 (*) [32])((long)*b + lVar21);
                  auVar40 = vpcmpgtq_avx2(auVar56,auVar45);
                  auVar45 = vblendvpd_avx(auVar45,auVar56,auVar40);
                  auVar54 = vpcmpgtq_avx2(auVar45,auVar50);
                  auVar53 = vblendvpd_avx(auVar50,auVar45,auVar54);
                  auVar45 = vblendvpd_avx(auVar39,*(undefined1 (*) [32])((long)*b_00 + lVar21),
                                          auVar54);
                  auVar41._0_8_ = -(ulong)(auVar53._0_8_ == auVar56._0_8_);
                  auVar41._8_8_ = -(ulong)(auVar53._8_8_ == auVar56._8_8_);
                  auVar41._16_8_ = -(ulong)(auVar53._16_8_ == auVar56._16_8_);
                  auVar41._24_8_ = -(ulong)(auVar53._24_8_ == auVar56._24_8_);
                  auVar40 = vblendvpd_avx(auVar45,*(undefined1 (*) [32])((long)*b_03 + lVar21),
                                          auVar41);
                  auVar56 = vblendvpd_avx(auVar46,*(undefined1 (*) [32])((long)*b_01 + lVar21),
                                          auVar54);
                  auVar61 = vblendvpd_avx(auVar56,*(undefined1 (*) [32])((long)*b_04 + lVar21),
                                          auVar41);
                  auVar52 = vpsubq_avx2(auVar52,_DAT_00909280);
                  auVar56 = vblendvpd_avx(auVar52,*(undefined1 (*) [32])((long)*b_02 + lVar21),
                                          auVar54);
                  auVar45 = vblendvpd_avx(auVar56,*(undefined1 (*) [32])((long)*b_05 + lVar21),
                                          auVar41);
                  *(undefined1 (*) [32])((long)*ptr + lVar21) = auVar53;
                  *(undefined1 (*) [32])((long)*b_03 + lVar21) = auVar40;
                  *(undefined1 (*) [32])((long)*b_04 + lVar21) = auVar61;
                  *(undefined1 (*) [32])((long)*b_05 + lVar21) = auVar45;
                  auVar56 = vpcmpgtq_avx2(auVar53,local_178);
                  local_178 = vblendvpd_avx(auVar53,local_178,auVar56);
                  auVar56 = vpcmpgtq_avx2(local_198,auVar53);
                  auVar56 = vblendvpd_avx(auVar53,local_198,auVar56);
                  auVar54 = vpcmpgtq_avx2(auVar56,auVar40);
                  auVar56 = vblendvpd_avx(auVar40,auVar56,auVar54);
                  auVar54 = vpcmpgtq_avx2(auVar56,auVar61);
                  auVar56 = vblendvpd_avx(auVar61,auVar56,auVar54);
                  auVar54 = vpcmpgtq_avx2(auVar56,auVar45);
                  local_198 = vblendvpd_avx(auVar45,auVar56,auVar54);
                  lVar21 = lVar21 + 0x20;
                } while (size << 5 != lVar21);
              } while (uVar33 != (uint)s2Len);
              alVar11 = ptr[uVar9];
              auVar44 = alVar11._16_16_;
              alVar1 = b_03[uVar9];
              auVar47 = alVar1._16_16_;
              alVar2 = b_04[uVar9];
              auVar35 = alVar2._16_16_;
              alVar4 = b_05[uVar9];
              auVar42 = alVar4._16_16_;
              if (iVar30 < 3) {
                iVar19 = 0;
                do {
                  auVar38 = vperm2i128_avx2((undefined1  [32])alVar11,(undefined1  [32])alVar11,8);
                  alVar11 = (__m256i)vpalignr_avx2((undefined1  [32])alVar11,auVar38,8);
                  auVar44 = alVar11._16_16_;
                  auVar38 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,8);
                  alVar1 = (__m256i)vpalignr_avx2((undefined1  [32])alVar1,auVar38,8);
                  auVar47 = alVar1._16_16_;
                  auVar38 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,8);
                  alVar2 = (__m256i)vpalignr_avx2((undefined1  [32])alVar2,auVar38,8);
                  auVar35 = alVar2._16_16_;
                  auVar38 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,8);
                  alVar4 = (__m256i)vpalignr_avx2((undefined1  [32])alVar4,auVar38,8);
                  auVar42 = alVar4._16_16_;
                  iVar19 = iVar19 + 1;
                } while (iVar19 < iVar18);
              }
              auVar13._8_8_ = uVar28;
              auVar13._0_8_ = uVar28;
              auVar13._16_8_ = uVar28;
              auVar13._24_8_ = uVar28;
              auVar38 = vpcmpgtq_avx2(auVar13,local_178);
              auVar14._8_8_ = lVar26;
              auVar14._0_8_ = lVar26;
              auVar14._16_8_ = lVar26;
              auVar14._24_8_ = lVar26;
              auVar56 = vpcmpgtq_avx2(local_198,auVar14);
              auVar38 = vpor_avx2(auVar56,auVar38);
              if ((((auVar38 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   SUB321(auVar38 >> 0x7f,0) == '\0') && SUB321(auVar38 >> 0xbf,0) == '\0') &&
                  -1 < auVar38[0x1f]) {
                uVar22 = vpextrq_avx(auVar44,1);
                iVar19 = (int)uVar22;
                uVar22 = vpextrq_avx(auVar47,1);
                iVar34 = (int)uVar22;
                uVar22 = vpextrq_avx(auVar35,1);
                iVar30 = (int)uVar22;
                uVar22 = vpextrq_avx(auVar42,1);
                iVar18 = (int)uVar22;
              }
              else {
                *(byte *)&ppVar20->flag = (byte)ppVar20->flag | 0x40;
                iVar19 = 0;
                iVar34 = 0;
                iVar30 = 0;
                iVar18 = 0;
                iVar17 = 0;
                uVar29 = 0;
              }
              ppVar20->score = iVar19;
              ppVar20->end_query = uVar29;
              ppVar20->end_ref = iVar17;
              ((ppVar20->field_4).stats)->matches = iVar34;
              ((ppVar20->field_4).stats)->similar = iVar30;
              ((ppVar20->field_4).stats)->length = iVar18;
              parasail_free(ptr_06);
              parasail_free(ptr_05);
              parasail_free(ptr_04);
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(b_05);
              parasail_free(b_04);
              parasail_free(b_03);
              parasail_free(ptr);
              parasail_free(b_02);
              parasail_free(b_01);
              parasail_free(b_00);
              parasail_free(b);
              return ppVar20;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvPm = NULL;
    __m256i* restrict pvPs = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHM = NULL;
    __m256i* restrict pvHS = NULL;
    __m256i* restrict pvHL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i* restrict pvGapperL = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    __m256i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m256i*)profile->profile64.score;
    pvPm = (__m256i*)profile->profile64.matches;
    pvPs = (__m256i*)profile->profile64.similar;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(segLen), 8);
    vNegInfFront = _mm256_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi64(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m256i(32, segLen);
    pvEM = parasail_memalign___m256i(32, segLen);
    pvES = parasail_memalign___m256i(32, segLen);
    pvEL = parasail_memalign___m256i(32, segLen);
    pvH  = parasail_memalign___m256i(32, segLen);
    pvHM = parasail_memalign___m256i(32, segLen);
    pvHS = parasail_memalign___m256i(32, segLen);
    pvHL = parasail_memalign___m256i(32, segLen);
    pvHMax  = parasail_memalign___m256i(32, segLen);
    pvHMMax = parasail_memalign___m256i(32, segLen);
    pvHSMax = parasail_memalign___m256i(32, segLen);
    pvHLMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);
    pvGapperL = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHM, vZero, segLen);
    parasail_memset___m256i(pvHS, vZero, segLen);
    parasail_memset___m256i(pvHL, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vZero, segLen);
    {
        __m256i vGapper = _mm256_sub_epi64(vZero,vGapO);
        __m256i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            _mm256_store_si256(pvGapperL+i, vGapperL);
            vGapper = _mm256_sub_epi64(vGapper, vGapE);
            vGapperL = _mm256_add_epi64(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vHt;
        __m256i vHtM;
        __m256i vHtS;
        __m256i vHtL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        __m256i vHp;
        __m256i vHpM;
        __m256i vHpS;
        __m256i vHpL;
        __m256i *pvW;
        __m256i vW;
        __m256i *pvWM;
        __m256i vWM;
        __m256i *pvWS;
        __m256i vWS;
        __m256i case1;
        __m256i case2;
        __m256i vGapper;
        __m256i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHpM = _mm256_load_si256(pvHM+(segLen-1));
        vHpS = _mm256_load_si256(pvHS+(segLen-1));
        vHpL = _mm256_load_si256(pvHL+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 8);
        vHpM = _mm256_slli_si256_rpl(vHpM, 8);
        vHpS = _mm256_slli_si256_rpl(vHpS, 8);
        vHpL = _mm256_slli_si256_rpl(vHpL, 8);
        vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vHM= _mm256_load_si256(pvHM+i);
            vHS= _mm256_load_si256(pvHS+i);
            vHL= _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM= _mm256_load_si256(pvEM+i);
            vES= _mm256_load_si256(pvES+i);
            vEL= _mm256_load_si256(pvEL+i);
            vW = _mm256_load_si256(pvW+i);
            vWM = _mm256_load_si256(pvWM+i);
            vWS = _mm256_load_si256(pvWS+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vGapperL = _mm256_load_si256(pvGapperL+i);
            vE_opn = _mm256_sub_epi64(vH, vGapO);
            vE_ext = _mm256_sub_epi64(vE, vGapE);
            case1 = _mm256_cmpgt_epi64(vE_opn, vE_ext);
            vE = _mm256_max_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(vEL, vHL, case1);
            vEL = _mm256_add_epi64(vEL, vOne);
            vGapper = _mm256_add_epi64(vHt, vGapper);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi64(vF, vGapper),
                    _mm256_cmpeq_epi64(vF, vGapper));
            vF = _mm256_max_epi64_rpl(vF, vGapper);
            vFM = _mm256_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm256_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm256_add_epi64(vHp, vW);
            vHpM = _mm256_add_epi64(vHpM, vWM);
            vHpS = _mm256_add_epi64(vHpS, vWS);
            vHpL = _mm256_add_epi64(vHpL, vOne);
            case1 = _mm256_cmpgt_epi64(vE, vHp);
            vHt = _mm256_max_epi64_rpl(vE, vHp);
            vHtM = _mm256_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm256_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm256_blendv_epi8(vHpL, vEL, case1);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvEM+i, vEM);
            _mm256_store_si256(pvES+i, vES);
            _mm256_store_si256(pvEL+i, vEL);
            _mm256_store_si256(pvH+i, vHp);
            _mm256_store_si256(pvHM+i, vHpM);
            _mm256_store_si256(pvHS+i, vHpS);
            _mm256_store_si256(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 8);
        vHtM = _mm256_slli_si256_rpl(vHtM, 8);
        vHtS = _mm256_slli_si256_rpl(vHtS, 8);
        vHtL = _mm256_slli_si256_rpl(vHtL, 8);
        vHt = _mm256_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm256_load_si256(pvGapper);
        vGapperL = _mm256_load_si256(pvGapperL);
        vGapper = _mm256_add_epi64(vHt, vGapper);
        case1 = _mm256_or_si256(
                _mm256_cmpgt_epi64(vGapper, vF),
                _mm256_cmpeq_epi64(vGapper, vF));
        vF = _mm256_max_epi64_rpl(vF, vGapper);
        vFM = _mm256_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm256_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm256_blendv_epi8(
                vFL,
                _mm256_add_epi64(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 8);
            __m256i vFtM = _mm256_slli_si256_rpl(vFM, 8);
            __m256i vFtS = _mm256_slli_si256_rpl(vFS, 8);
            __m256i vFtL = _mm256_slli_si256_rpl(vFL, 8);
            vFt = _mm256_add_epi64(vFt, vSegLenXgap);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi64(vFt, vF),
                    _mm256_cmpeq_epi64(vFt, vF));
            vF = _mm256_max_epi64_rpl(vF, vFt);
            vFM = _mm256_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm256_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm256_blendv_epi8(
                    vFL,
                    _mm256_add_epi64(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 8);
        vFM = _mm256_slli_si256_rpl(vFM, 8);
        vFS = _mm256_slli_si256_rpl(vFS, 8);
        vFL = _mm256_slli_si256_rpl(vFL, 8);
        vF = _mm256_add_epi64(vF, vNegInfFront);
        case1 = _mm256_cmpgt_epi64(vF, vHt);
        vH = _mm256_max_epi64_rpl(vF, vHt);
        vHM = _mm256_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm256_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm256_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm256_load_si256(pvH+i);
            vHpM = _mm256_load_si256(pvHM+i);
            vHpS = _mm256_load_si256(pvHS+i);
            vHpL = _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM = _mm256_load_si256(pvEM+i);
            vES = _mm256_load_si256(pvES+i);
            vEL = _mm256_load_si256(pvEL+i);
            vF_opn = _mm256_sub_epi64(vH, vGapO);
            vF_ext = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(vFL, vHL, case1);
            vFL = _mm256_add_epi64(vFL, vOne);
            vH = _mm256_max_epi64_rpl(vHp, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            case1 = _mm256_cmpeq_epi64(vH, vHp);
            case2 = _mm256_cmpeq_epi64(vH, vF);
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm256_store_si256(pvH+i, vH);
            _mm256_store_si256(pvHM+i, vHM);
            _mm256_store_si256(pvHS+i, vHS);
            _mm256_store_si256(pvHL+i, vHL);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            vHM = _mm256_load_si256(pvHM + offset);
            vHS = _mm256_load_si256(pvHS + offset);
            vHL = _mm256_load_si256(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
                vHM = _mm256_slli_si256_rpl(vHM, 8);
                vHS = _mm256_slli_si256_rpl(vHS, 8);
                vHL = _mm256_slli_si256_rpl(vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
            result->stats->rowcols->length_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        __m256i vHM = _mm256_load_si256(pvHM+i);
        __m256i vHS = _mm256_load_si256(pvHS+i);
        __m256i vHL = _mm256_load_si256(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        __m256i vHM = _mm256_load_si256(pvHM + offset);
        __m256i vHS = _mm256_load_si256(pvHS + offset);
        __m256i vHL = _mm256_load_si256(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
            vHM = _mm256_slli_si256_rpl(vHM, 8);
            vHS = _mm256_slli_si256_rpl(vHS, 8);
            vHL = _mm256_slli_si256_rpl(vHL, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}